

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void destStoreGray8(QRasterBuffer *rasterBuffer,int x,int y,uint *buffer,int length)

{
  long lVar1;
  long lVar2;
  uchar *puVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QColorTransform tf;
  QColorSpace fromCS;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = rasterBuffer->bytes_per_line;
  puVar3 = rasterBuffer->m_buffer;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < length) {
    uVar6 = (ulong)(uint)length;
  }
  do {
    if (uVar6 == uVar5) {
LAB_005bc324:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    bVar4 = qIsGray(buffer[uVar5]);
    if (!bVar4) {
      fromCS.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QColorSpacePrivate>)&DAT_aaaaaaaaaaaaaaaa;
      bVar4 = QColorSpace::isValid(&rasterBuffer->colorSpace);
      if (bVar4) {
        QColorSpace::QColorSpace(&fromCS,&rasterBuffer->colorSpace);
      }
      else {
        QColorSpace::QColorSpace(&fromCS,SRgb);
      }
      tf.d.d.ptr = (QExplicitlySharedDataPointer<QColorTransformPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QColorSpacePrivate::transformationToXYZ((QColorSpacePrivate *)&tf);
      QColorTransformPrivate::apply<unsigned_char,unsigned_int>
                ((QColorTransformPrivate *)tf.d.d.ptr,puVar3 + (long)x + y * lVar2,buffer,
                 (long)length,(TransformFlags)0x2);
      QColorTransform::~QColorTransform(&tf);
      QColorSpace::~QColorSpace(&fromCS);
      goto LAB_005bc324;
    }
    (puVar3 + (long)x + y * lVar2)[uVar5] = *(uchar *)((long)buffer + uVar5 * 4 + 2);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static void QT_FASTCALL destStoreGray8(QRasterBuffer *rasterBuffer, int x, int y, const uint *buffer, int length)
{
    uchar *data = rasterBuffer->scanLine(y) + x;

    bool failed = false;
    for (int k = 0; k < length; ++k) {
        if (!qIsGray(buffer[k])) {
            failed = true;
            break;
        }
        data[k] = qRed(buffer[k]);
    }
    if (failed) { // Non-gray colors
        QColorSpace fromCS = rasterBuffer->colorSpace.isValid() ? rasterBuffer->colorSpace : QColorSpace::SRgb;
        QColorTransform tf = QColorSpacePrivate::get(fromCS)->transformationToXYZ();
        QColorTransformPrivate *tfd = QColorTransformPrivate::get(tf);

        tfd->apply(data, buffer, length, QColorTransformPrivate::InputPremultiplied);
    }
}